

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void __thiscall
wasm::ReReloop::addSwitchBranch
          (ReReloop *this,Block *from,Block *to,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *values)

{
  pointer this_00;
  bool bVar1;
  reference puVar2;
  uint local_5c;
  iterator iStack_58;
  uint i;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> list;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *values_local;
  Block *to_local;
  Block *from_local;
  ReReloop *this_local;
  
  list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)values;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  this_00 = list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  iStack_58 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
    local_5c = *puVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,&local_5c);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
  }
  CFG::Block::AddSwitchBranchTo
            (from,to,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,
             (Expression *)0x0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  return;
}

Assistant:

void addSwitchBranch(CFG::Block* from,
                       CFG::Block* to,
                       const std::set<Index>& values) {
    std::vector<Index> list;
    for (auto i : values) {
      list.push_back(i);
    }
    from->AddSwitchBranchTo(to, std::move(list));
  }